

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O2

ssize_t __thiscall
Imf_2_5::StdISStream::read(StdISStream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined7 extraout_var;
  InputExc *this_00;
  undefined4 in_register_00000034;
  
  if (((&this->field_0x48)[*(long *)(*(long *)&this->_is + -0x18)] & 5) == 0) {
    anon_unknown_0::clearError();
    std::istream::read((char *)&this->_is,CONCAT44(in_register_00000034,__fd));
    bVar1 = anon_unknown_0::checkError((istream *)&this->_is,(long)(int)__buf);
    return CONCAT71(extraout_var,bVar1);
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"Unexpected end of file.");
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

bool
StdISStream::read (char c[/*n*/], int n)
{
    if (!_is)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    clearError();
    _is.read (c, n);
    return checkError (_is, n);
}